

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_makenumber(LispPTR tosm1,LispPTR tos)

{
  uint *NAddr;
  uint uVar1;
  LispPTR LVar2;
  
  if ((tos & 0xffff0000) == 0xe0000 && (tosm1 & 0xffff0000) == 0xe0000) {
    if (tosm1 << 0x10 == 0xffff0000) {
      LVar2 = tos | 0xf0000;
    }
    else {
      uVar1 = tos & 0xffff | tosm1 << 0x10;
      if ((tosm1 & 0xffff) != 0) {
        NAddr = (uint *)createcell68k(2);
        *NAddr = uVar1;
        LVar2 = LAddrFromNative(NAddr);
        return LVar2;
      }
      LVar2 = uVar1 | 0xe0000;
    }
  }
  else {
    MachineState.errorexit = 1;
    LVar2 = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return LVar2;
}

Assistant:

LispPTR N_OP_makenumber(LispPTR tosm1, LispPTR tos) {
  int result;

  if (((tosm1 & 0xFFFF0000) != S_POSITIVE) || ((tos & 0xFFFF0000) != S_POSITIVE)) ERROR_EXIT(tos);
  /* UB: left shift of 49152 by 16 places cannot be represented in type 'int' */
  result = (int)(((tosm1 & 0xffff) << 16) | (tos & 0xffff));
  N_ARITH_SWITCH(result);
}